

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O1

IRet * __thiscall
vkt::shaderexecutor::Functions::GetComponent<tcu::Matrix<float,_2,_2>_>::doApply
          (IRet *__return_storage_ptr__,GetComponent<tcu::Matrix<float,_2,_2>_> *this,
          EvalContext *param_1,IArgs *iargs)

{
  long lVar1;
  int iVar2;
  undefined8 local_58;
  double dStack_50;
  double local_48;
  undefined8 uStack_40;
  double local_38;
  double dStack_30;
  
  lVar1 = 0x10;
  do {
    *(undefined1 *)((long)__return_storage_ptr__->m_data + lVar1 + -0x10) = 0;
    *(undefined8 *)((long)__return_storage_ptr__->m_data + lVar1 + -8) = 0x7ff0000000000000;
    *(undefined8 *)(&__return_storage_ptr__->m_data[0].m_hasNaN + lVar1) = 0xfff0000000000000;
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x40);
  lVar1 = 0x10;
  do {
    *(undefined1 *)((long)__return_storage_ptr__->m_data + lVar1 + -0x10) = 0;
    *(undefined8 *)((long)__return_storage_ptr__->m_data + lVar1 + -8) = 0x7ff0000000000000;
    *(undefined8 *)(&__return_storage_ptr__->m_data[0].m_hasNaN + lVar1) = 0xfff0000000000000;
    lVar1 = lVar1 + 0x18;
  } while (lVar1 == 0x28);
  iVar2 = 0;
  lVar1 = 0;
  do {
    if ((iargs->b->m_lo <= (double)iVar2) && ((double)iVar2 <= iargs->b->m_hi)) {
      ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doUnion
                (__return_storage_ptr__,
                 (IVal *)(&(iargs->a->m_data).m_data[0].m_data[0].m_hasNaN + lVar1));
      __return_storage_ptr__->m_data[1].m_lo = local_38;
      __return_storage_ptr__->m_data[1].m_hi = dStack_30;
      __return_storage_ptr__->m_data[0].m_hi = local_48;
      *(undefined8 *)(__return_storage_ptr__->m_data + 1) = uStack_40;
      *(undefined8 *)__return_storage_ptr__->m_data = local_58;
      __return_storage_ptr__->m_data[0].m_lo = dStack_50;
    }
    lVar1 = lVar1 + 0x30;
    iVar2 = iVar2 + 1;
  } while (lVar1 == 0x30);
  return __return_storage_ptr__;
}

Assistant:

IRet		doApply		(const EvalContext&,
							 const typename GetComponent::IArgs& iargs) const
	{
		IRet ret;

		for (int compNdx = 0; compNdx < T::SIZE; ++compNdx)
		{
			if (iargs.b.contains(compNdx))
				ret = unionIVal<typename T::Element>(ret, iargs.a[compNdx]);
		}

		return ret;
	}